

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O3

WJTL_STATUS
MakeJsonAndVerify(void *Structure,JlMarshallElement *StructDescription,
                 uint32_t StructDescriptionCount,char *ExpectedJson)

{
  JL_STATUS JVar1;
  int iVar2;
  JL_STATUS JVar3;
  WJTL_STATUS WVar4;
  char *jsonString;
  char *local_38;
  
  local_38 = (char *)0x0;
  JVar1 = JlStructToJson(Structure,StructDescription,(ulong)StructDescriptionCount,false,&local_38);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlStructToJson(Structure, StructDescription,StructDescriptionCount, 0, &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"MakeJsonAndVerify",0x39);
  iVar2 = strcmp(local_38,ExpectedJson);
  WjTestLib_Assert(iVar2 == 0,"strcmp( jsonString, ExpectedJson ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"MakeJsonAndVerify",0x3a);
  JVar3 = JlFreeJsonStringBuffer(&local_38);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeJsonStringBuffer( &jsonString ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"MakeJsonAndVerify",0x3b);
  WVar4 = WJTL_STATUS_FAILED;
  if ((iVar2 == 0 && JVar1 == JL_STATUS_SUCCESS) && JVar3 == JL_STATUS_SUCCESS) {
    WVar4 = WJTL_STATUS_SUCCESS;
  }
  return WVar4;
}

Assistant:

static
WJTL_STATUS
    MakeJsonAndVerify
    (
        void const*                 Structure,                      // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        uint32_t                    StructDescriptionCount,         // [in]
        char const*                 ExpectedJson                    // [in]
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    char* jsonString = NULL;
    JL_ASSERT_SUCCESS( JlStructToJson(Structure, StructDescription,StructDescriptionCount, false, &jsonString ) );
    JL_ASSERT( strcmp( jsonString, ExpectedJson ) == 0 );
    JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &jsonString ) );

    return TestReturn;
}